

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_ce.cpp
# Opt level: O2

void msd_CE2_16bit(uchar **strings,size_t n,size_t depth)

{
  ushort uVar1;
  uchar *puVar2;
  size_t i_1;
  void *__ptr;
  void *__src;
  long lVar3;
  uint16_t uVar4;
  ulong uVar5;
  size_t i;
  size_t sVar6;
  ulong n_00;
  uint16_t bucketsize [256];
  uint16_t bucketindex [256];
  
  if (n < 0x20) {
    insertion_sort(strings,(int)n,depth);
    return;
  }
  memset(bucketsize,0,0x200);
  __ptr = malloc(n);
  for (sVar6 = 0; n != sVar6; sVar6 = sVar6 + 1) {
    *(uchar *)((long)__ptr + sVar6) = strings[sVar6][depth];
  }
  for (sVar6 = 0; n != sVar6; sVar6 = sVar6 + 1) {
    bucketsize[*(byte *)((long)__ptr + sVar6)] = bucketsize[*(byte *)((long)__ptr + sVar6)] + 1;
  }
  __src = malloc(n * 8);
  bucketindex[0] = 0;
  uVar4 = 0;
  for (lVar3 = 1; lVar3 != 0x100; lVar3 = lVar3 + 1) {
    uVar4 = uVar4 + bucketsize[lVar3 + -1];
    bucketindex[lVar3] = uVar4;
  }
  for (sVar6 = 0; n != sVar6; sVar6 = sVar6 + 1) {
    puVar2 = strings[sVar6];
    uVar1 = bucketindex[*(byte *)((long)__ptr + sVar6)];
    bucketindex[*(byte *)((long)__ptr + sVar6)] = uVar1 + 1;
    *(uchar **)((long)__src + (ulong)uVar1 * 8) = puVar2;
  }
  memcpy(strings,__src,n * 8);
  free(__src);
  free(__ptr);
  uVar5 = (ulong)bucketsize[0];
  for (lVar3 = 1; lVar3 != 0x100; lVar3 = lVar3 + 1) {
    n_00 = (ulong)bucketsize[lVar3];
    if (n_00 != 0) {
      msd_CE2_16bit(strings + uVar5,n_00,depth + 1);
      uVar5 = uVar5 + n_00;
    }
  }
  return;
}

Assistant:

void
msd_CE2_16bit(unsigned char** strings, size_t n, size_t depth)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	uint16_t bucketsize[256] = {0};
	unsigned char* restrict oracle =
		(unsigned char*) malloc(n);
	for (size_t i=0; i < n; ++i)
		oracle[i] = strings[i][depth];
	for (size_t i=0; i < n; ++i)
		++bucketsize[oracle[i]];
	unsigned char** restrict sorted = (unsigned char**)
		malloc(n*sizeof(unsigned char*));
	uint16_t bucketindex[256];
	bucketindex[0] = 0;
	for (size_t i=1; i < 256; ++i)
		bucketindex[i] = bucketindex[i-1]+bucketsize[i-1];
	for (size_t i=0; i < n; ++i)
		sorted[bucketindex[oracle[i]]++] = strings[i];
	memcpy(strings, sorted, n*sizeof(unsigned char*));
	free(sorted);
	free(oracle);
	size_t bsum = bucketsize[0];
	for (size_t i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_CE2_16bit(strings+bsum, bucketsize[i], depth+1);
		bsum += bucketsize[i];
	}
}